

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * soul::padded(string *__return_storage_ptr__,string *s,int minSize)

{
  size_t in_RCX;
  char c;
  int iVar1;
  string sStack_38;
  
  iVar1 = minSize - (int)s->_M_string_length;
  c = (char)iVar1;
  if (iVar1 < 2) {
    c = '\x01';
  }
  repeatedCharacter_abi_cxx11_(&sStack_38,(soul *)0x20,c,in_RCX);
  std::operator+(__return_storage_ptr__,s,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string padded (const std::string& s, int minSize)
{
    auto extraNeeded = std::max (1, minSize - (int) s.length());
    return s + repeatedCharacter (' ', (size_t) extraNeeded);
}